

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlator.cc
# Opt level: O1

int decoder::correlate(uint8_t *data,size_t len,int *maxOut,correlationType *maxType)

{
  correlationType cVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  correlationType cVar7;
  uint uVar8;
  uint j;
  long lVar9;
  int local_48 [8];
  int max [4];
  int pos [4];
  
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (len != 0) {
    uVar3 = 0;
    uVar8 = 0;
    do {
      uVar8 = (uint)(data[uVar3] >> 7) + uVar8 * 2;
      uVar2 = (uint)uVar3;
      if (0x3e < uVar2) {
        puVar4 = &(anonymous_namespace)::encodedSyncWords;
        lVar9 = 0;
        do {
          uVar5 = (*puVar4 ^ uVar8) - ((*puVar4 ^ uVar8) >> 1 & 0x55555555);
          uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
          iVar6 = 0x40 - (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18);
          if (local_48[lVar9] < iVar6) {
            local_48[lVar9] = iVar6;
            local_48[lVar9 + 4] = uVar2 - 0x3f;
          }
          lVar9 = lVar9 + 1;
          puVar4 = puVar4 + 2;
        } while (lVar9 != 4);
      }
      uVar3 = (ulong)(uVar2 + 1);
    } while (uVar3 < len);
  }
  lVar9 = 0;
  cVar7 = LRIT_PHASE_000;
  do {
    cVar1 = (correlationType)lVar9;
    if (local_48[lVar9] <= local_48[(int)cVar7]) {
      cVar1 = cVar7;
    }
    cVar7 = cVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  if (maxOut != (int *)0x0) {
    *maxOut = local_48[(int)cVar7];
  }
  if (maxType != (correlationType *)0x0) {
    *maxType = cVar7;
  }
  return local_48[(long)(int)cVar7 + 4];
}

Assistant:

int correlate(uint8_t* data, size_t len, int* maxOut, correlationType* maxType) {
  uint64_t tmp = 0;

  // Position with maximum correlation
  int pos[4] = { 0, 0, 0, 0 };

  // Maximum correlation
  int max[4] = { 0, 0, 0, 0 };

  // Find maximum correlation
  for (unsigned i = 0; i < len; i++) {
    // If data >= 128 (i.e. MSB == 1), set bit in stream.
    tmp = (tmp << 1) | (data[i] & 0x80) >> 7;
    if (i < (encodedSyncWordBits - 1)) {
      continue;
    }

    // Match tmp against encoded sync words
    for (unsigned j = 0; j < 4; j++) {
      auto v = 64 - __builtin_popcount(tmp ^ encodedSyncWords[j]);
      if (v > max[j]) {
        max[j] = v;
        pos[j] = i - (encodedSyncWordBits - 1);
      }
    }
  }

  // Return position for best correlating sync word
  int j = 0;
  for (unsigned i = 0; i < 4; i++) {
    if (max[i] > max[j]) {
      j = i;
    }
  }

  if (maxOut != nullptr) {
    *maxOut = max[j];
  }
  if (maxType != nullptr) {
    *maxType = static_cast<correlationType>(j);
  }
  return pos[j];
}